

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O0

StringRef llvm::dwarf::InlineCodeString(uint Code)

{
  undefined1 auStack_18 [4];
  uint Code_local;
  
  switch(Code) {
  case 0:
    StringRef::StringRef((StringRef *)auStack_18,"DW_INL_not_inlined");
    break;
  case 1:
    StringRef::StringRef((StringRef *)auStack_18,"DW_INL_inlined");
    break;
  case 2:
    StringRef::StringRef((StringRef *)auStack_18,"DW_INL_declared_not_inlined");
    break;
  case 3:
    StringRef::StringRef((StringRef *)auStack_18,"DW_INL_declared_inlined");
    break;
  default:
    memset(auStack_18,0,0x10);
    StringRef::StringRef((StringRef *)auStack_18);
  }
  return _auStack_18;
}

Assistant:

StringRef llvm::dwarf::InlineCodeString(unsigned Code) {
  switch (Code) {
  case DW_INL_not_inlined:
    return "DW_INL_not_inlined";
  case DW_INL_inlined:
    return "DW_INL_inlined";
  case DW_INL_declared_not_inlined:
    return "DW_INL_declared_not_inlined";
  case DW_INL_declared_inlined:
    return "DW_INL_declared_inlined";
  }
  return StringRef();
}